

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupOrpos(Aig_Man_t *p,int fAddRegs)

{
  Aig_Man_t *p_00;
  char *pcVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  int iVar5;
  
  if (0 < p->nRegs) {
    if (p->nConstrs < 1) {
      p_00 = Aig_ManStart(p->vObjs->nSize);
      pcVar1 = Abc_UtilStrsav(p->pName);
      p_00->pName = pcVar1;
      pcVar1 = Abc_UtilStrsav(p->pSpec);
      p_00->pSpec = pcVar1;
      Aig_ManCleanData(p);
      p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
      for (iVar5 = 0; iVar5 < p->vCis->nSize; iVar5 = iVar5 + 1) {
        pvVar2 = Vec_PtrEntry(p->vCis,iVar5);
        pAVar3 = Aig_ObjCreateCi(p_00);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
      }
      if (fAddRegs == 0) {
        p_00->nRegs = 0;
        iVar5 = p->nRegs + p->nTruePis;
      }
      else {
        p_00->nRegs = p->nRegs;
        iVar5 = p->nTruePis;
      }
      p_00->nTruePis = iVar5;
      p_00->nTruePos = 1;
      for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar5);
        if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
          pAVar4 = Aig_ObjChild0Copy(pAVar3);
          p1 = Aig_ObjChild1Copy(pAVar3);
          pAVar4 = Aig_And(p_00,pAVar4,p1);
          (pAVar3->field_5).pData = pAVar4;
        }
      }
      pAVar3 = (Aig_Obj_t *)((ulong)p_00->pConst1 ^ 1);
      for (iVar5 = 0; iVar5 < p->nObjs[3] - p->nRegs; iVar5 = iVar5 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar5);
        pAVar4 = Aig_ObjChild0Copy(pAVar4);
        pAVar3 = Aig_Or(p_00,pAVar3,pAVar4);
      }
      Aig_ObjCreateCo(p_00,pAVar3);
      if (fAddRegs != 0) {
        for (iVar5 = p->nObjs[3] - p->nRegs; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar5);
          pAVar3 = Aig_ObjChild0Copy(pAVar3);
          Aig_ObjCreateCo(p_00,pAVar3);
        }
      }
      Aig_ManCleanup(p_00);
    }
    else {
      puts("The AIG manager should have no constraints.");
      p_00 = (Aig_Man_t *)0x0;
    }
    return p_00;
  }
  __assert_fail("Aig_ManRegNum(p) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                ,0x450,"Aig_Man_t *Aig_ManDupOrpos(Aig_Man_t *, int)");
}

Assistant:

Aig_Man_t * Aig_ManDupOrpos( Aig_Man_t * p, int fAddRegs )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pMiter;
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    if ( p->nConstrs > 0 )
    {
        printf( "The AIG manager should have no constraints.\n" );
        return NULL;
    }
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // set registers
    pNew->nRegs    = fAddRegs? p->nRegs : 0;
    pNew->nTruePis = fAddRegs? p->nTruePis : p->nTruePis + p->nRegs;
    pNew->nTruePos = 1;
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create the PO
    pMiter = Aig_ManConst0(pNew);
    Aig_ManForEachPoSeq( p, pObj, i )
        pMiter = Aig_Or( pNew, pMiter, Aig_ObjChild0Copy(pObj) ); 
    Aig_ObjCreateCo( pNew, pMiter );
    // create register inputs with MUXes
    if ( fAddRegs )
    {
        Aig_ManForEachLiSeq( p, pObj, i )
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}